

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X11MiniFB.c
# Opt level: O2

mfb_window * mfb_open_ex(char *title,uint width,uint height,uint flags)

{
  int *piVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  undefined8 uVar9;
  void *pvVar10;
  _Bool _Var11;
  SWindowData *window_data;
  SWindowData *window_data_x11;
  void *pvVar12;
  long lVar13;
  undefined8 uVar14;
  mfb_timer *pmVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  int formatCount;
  Atom sa_p;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  XSetWindowAttributes windowAttributes;
  
  window_data = (SWindowData *)calloc(1,0x2a8);
  if (window_data != (SWindowData *)0x0) {
    window_data_x11 = (SWindowData *)calloc(1,0x38);
    if (window_data_x11 != (SWindowData *)0x0) {
      window_data->specific = window_data_x11;
      pvVar12 = (void *)XOpenDisplay(0);
      window_data_x11->user_data = pvVar12;
      if (pvVar12 != (void *)0x0) {
        init_keycodes((SWindowData_X11 *)window_data_x11);
        pvVar12 = window_data_x11->user_data;
        iVar3 = *(int *)((long)pvVar12 + 0xe0);
        *(int *)&window_data_x11->active_func = iVar3;
        uVar14 = *(undefined8 *)(*(long *)((long)pvVar12 + 0xe8) + 0x40 + (long)iVar3 * 0x80);
        lVar13 = XListPixmapFormats(pvVar12,&formatCount);
        lVar8 = *(long *)((long)window_data_x11->user_data + 0xe8);
        iVar3 = *(int *)(lVar8 + 0x38 + (long)*(int *)&window_data_x11->active_func * 0x80);
        uVar9 = *(undefined8 *)
                 (lVar8 + 0x10 + (long)*(int *)((long)window_data_x11->user_data + 0xe0) * 0x80);
        uVar17 = (ulong)(uint)formatCount;
        if (formatCount < 1) {
          uVar17 = 0;
        }
        uVar20 = 0;
        do {
          uVar2 = uVar20 + 0xc;
          if (uVar17 * 0xc + 0xc == uVar2) {
            XFree(lVar13);
            goto LAB_00102e67;
          }
          piVar1 = (int *)(lVar13 + uVar20);
          uVar20 = uVar2;
        } while (iVar3 != *piVar1);
        iVar4 = *(int *)(lVar13 + -8 + uVar2);
        XFree(lVar13);
        if (iVar4 == 0x20) {
          lVar8 = *(long *)((long)window_data_x11->user_data + 0xe8);
          lVar13 = (long)*(int *)&window_data_x11->active_func * 0x80;
          uVar5 = *(uint *)(lVar8 + 0x18 + lVar13);
          uVar6 = *(uint *)(lVar8 + 0x1c + lVar13);
          windowAttributes.background_pixel = *(unsigned_long *)(lVar8 + 0x60 + lVar13);
          windowAttributes.backing_store = 0;
          window_data->window_width = width;
          window_data->window_height = height;
          window_data->buffer_width = width;
          window_data->buffer_height = height;
          window_data->buffer_stride = width * 4;
          windowAttributes.border_pixel = windowAttributes.background_pixel;
          calc_dst_factor(window_data,width,height);
          uVar18 = 0;
          uVar16 = 0;
          uVar7 = uVar6;
          uVar19 = uVar5;
          if ((flags & 4) == 0) {
            uVar18 = uVar5 - width >> 1;
            uVar16 = uVar6 - height >> 1;
            uVar7 = height;
            uVar19 = width;
          }
          pvVar12 = (void *)XCreateWindow(window_data_x11->user_data,uVar9,uVar18,uVar16,uVar19,
                                          uVar7,0,iVar3,1,uVar14,0x4a,&windowAttributes);
          window_data_x11->specific = pvVar12;
          if (pvVar12 == (void *)0x0) {
            return (mfb_window *)0x0;
          }
          XSelectInput(window_data_x11->user_data,pvVar12,0x22807f);
          XStoreName(window_data_x11->user_data,window_data_x11->specific,title);
          if ((flags & 8) != 0) {
            local_d8 = 0;
            uStack_d0 = 0;
            local_e8 = 0;
            uStack_e0 = 0;
            sa_p = 2;
            uVar14 = XInternAtom(window_data_x11->user_data,"_MOTIF_WM_HINTS",1);
            XChangeProperty(window_data_x11->user_data,window_data_x11->specific,uVar14,uVar14,0x20,
                            0,&sa_p,5);
          }
          if ((flags & 0x10) != 0) {
            sa_p = XInternAtom(window_data_x11->user_data,"_NET_WM_STATE_ABOVE",0);
            pvVar12 = window_data_x11->specific;
            pvVar10 = window_data_x11->user_data;
            uVar14 = XInternAtom(pvVar10,"_NET_WM_STATE",0);
            XChangeProperty(pvVar10,pvVar12,uVar14,4,0x20,0,&sa_p,1);
          }
          if ((flags & 2) != 0) {
            sa_p = XInternAtom(window_data_x11->user_data,"_NET_WM_STATE_FULLSCREEN",1);
            pvVar12 = window_data_x11->specific;
            pvVar10 = window_data_x11->user_data;
            uVar14 = XInternAtom(pvVar10,"_NET_WM_STATE",1);
            XChangeProperty(pvVar10,pvVar12,uVar14,4,0x20,0,&sa_p,1);
          }
          sa_p = 0x34;
          local_e8 = 0;
          local_d8 = CONCAT44(height,width);
          if ((flags & 1) == 0) {
            uVar6 = height;
            uVar5 = width;
          }
          uStack_d0 = CONCAT44(uVar6,uVar5);
          _Var11 = create_GL_context(window_data);
          if (!_Var11) {
            return (mfb_window *)0x0;
          }
          XSetWMNormalHints(window_data_x11->user_data,window_data_x11->specific,&sa_p);
          XClearWindow(window_data_x11->user_data,window_data_x11->specific);
          XMapRaised(window_data_x11->user_data,window_data_x11->specific);
          XFlush(window_data_x11->user_data);
          window_data_x11->resize_func =
               *(mfb_resize_func *)
                (*(long *)((long)window_data_x11->user_data + 0xe8) + 0x48 +
                (long)*(int *)&window_data_x11->active_func * 0x80);
          pmVar15 = mfb_timer_create();
          window_data_x11->mouse_btn_func = (mfb_mouse_button_func)pmVar15;
          mfb_set_keyboard_callback((mfb_window *)window_data,keyboard_default);
          window_data->is_initialized = true;
          return (mfb_window *)window_data;
        }
LAB_00102e67:
        XCloseDisplay(window_data_x11->user_data);
        return (mfb_window *)0x0;
      }
      free(window_data);
      window_data = window_data_x11;
    }
    free(window_data);
  }
  return (mfb_window *)0x0;
}

Assistant:

struct mfb_window *
mfb_open_ex(const char *title, unsigned width, unsigned height, unsigned flags) {
    int depth, i, formatCount, convDepth = -1;
    XPixmapFormatValues* formats;
    XSetWindowAttributes windowAttributes;
    XSizeHints sizeHints;
    Visual* visual;

    SWindowData *window_data = (SWindowData *) malloc(sizeof(SWindowData));
    if (!window_data) {
        return 0x0;
    }
    memset(window_data, 0, sizeof(SWindowData));

    SWindowData_X11 *window_data_x11 = (SWindowData_X11 *) malloc(sizeof(SWindowData_X11));
    if (!window_data_x11) {
        free(window_data);
        return 0x0;
    }
    memset(window_data_x11, 0, sizeof(SWindowData_X11));
    window_data->specific = window_data_x11;

    window_data_x11->display = XOpenDisplay(0);
    if (!window_data_x11->display) {
        free(window_data);
        free(window_data_x11);
        return 0x0;
    }
    
    init_keycodes(window_data_x11);

    window_data_x11->screen = DefaultScreen(window_data_x11->display);

    visual   = DefaultVisual(window_data_x11->display, window_data_x11->screen);
    formats  = XListPixmapFormats(window_data_x11->display, &formatCount);
    depth    = DefaultDepth(window_data_x11->display, window_data_x11->screen);

    Window defaultRootWindow = DefaultRootWindow(window_data_x11->display);

    for (i = 0; i < formatCount; ++i)
    {
        if (depth == formats[i].depth)
        {
            convDepth = formats[i].bits_per_pixel;
            break;
        }
    }
  
    XFree(formats);

    // We only support 32-bit right now
    if (convDepth != 32)
    {
        XCloseDisplay(window_data_x11->display);
        return 0x0;
    }

    int screenWidth  = DisplayWidth(window_data_x11->display, window_data_x11->screen);
    int screenHeight = DisplayHeight(window_data_x11->display, window_data_x11->screen);

    windowAttributes.border_pixel     = BlackPixel(window_data_x11->display, window_data_x11->screen);
    windowAttributes.background_pixel = BlackPixel(window_data_x11->display, window_data_x11->screen);
    windowAttributes.backing_store    = NotUseful;

    int posX, posY;
    int windowWidth, windowHeight;

    window_data->window_width  = width;
    window_data->window_height = height;
    window_data->buffer_width  = width;
    window_data->buffer_height = height;
    window_data->buffer_stride = width * 4;
    calc_dst_factor(window_data, width, height);

    if (flags & WF_FULLSCREEN_DESKTOP) {
        posX         = 0;
        posY         = 0;
        windowWidth  = screenWidth;
        windowHeight = screenHeight;
    }
    else {
        posX         = (screenWidth  - width)  / 2;
        posY         = (screenHeight - height) / 2;
        windowWidth  = width;
        windowHeight = height;
    }

    window_data_x11->window = XCreateWindow(
                    window_data_x11->display, 
                    defaultRootWindow, 
                    posX, posY, 
                    windowWidth, windowHeight, 
                    0, 
                    depth, 
                    InputOutput,
                    visual, 
                    CWBackPixel | CWBorderPixel | CWBackingStore,
                    &windowAttributes);
    if (!window_data_x11->window)
        return 0x0;

    XSelectInput(window_data_x11->display, window_data_x11->window, 
        KeyPressMask | KeyReleaseMask 
        | ButtonPressMask | ButtonReleaseMask | PointerMotionMask 
        | StructureNotifyMask | ExposureMask 
        | FocusChangeMask
        | EnterWindowMask | LeaveWindowMask
    );

    XStoreName(window_data_x11->display, window_data_x11->window, title);

    if (flags & WF_BORDERLESS) {
        struct StyleHints {
            unsigned long   flags;
            unsigned long   functions;
            unsigned long   decorations;
            long            inputMode;
            unsigned long   status;
        } sh = {
            .flags       = 2,
            .functions   = 0,
            .decorations = 0,
            .inputMode   = 0,
            .status      = 0,
        };
        Atom sh_p = XInternAtom(window_data_x11->display, "_MOTIF_WM_HINTS", True);
        XChangeProperty(window_data_x11->display, window_data_x11->window, sh_p, sh_p, 32, PropModeReplace, (unsigned char*)&sh, 5);
    }

    if (flags & WF_ALWAYS_ON_TOP) {
        Atom sa_p = XInternAtom(window_data_x11->display, "_NET_WM_STATE_ABOVE", False);
        XChangeProperty(window_data_x11->display, window_data_x11->window, XInternAtom(window_data_x11->display, "_NET_WM_STATE", False), XA_ATOM, 32, PropModeReplace, (unsigned char *)&sa_p, 1);
    }

    if (flags & WF_FULLSCREEN) {
        Atom sf_p = XInternAtom(window_data_x11->display, "_NET_WM_STATE_FULLSCREEN", True);
        XChangeProperty(window_data_x11->display, window_data_x11->window, XInternAtom(window_data_x11->display, "_NET_WM_STATE", True), XA_ATOM, 32, PropModeReplace, (unsigned char*)&sf_p, 1);
    }

    sizeHints.flags      = PPosition | PMinSize | PMaxSize;
    sizeHints.x          = 0;
    sizeHints.y          = 0;
    sizeHints.min_width  = width;
    sizeHints.min_height = height;
    if (flags & WF_RESIZABLE) {
        sizeHints.max_width  = screenWidth;
        sizeHints.max_height = screenHeight;
    }
    else {
        sizeHints.max_width  = width;
        sizeHints.max_height = height;
    }

#if defined(USE_OPENGL_API)
    if(create_GL_context(window_data) == false) {
        return 0x0;
    }

#else
    window_data_x11->image = XCreateImage(window_data_x11->display, CopyFromParent, depth, ZPixmap, 0, 0x0, width, height, 32, width * 4);
#endif

    XSetWMNormalHints(window_data_x11->display, window_data_x11->window, &sizeHints);
    XClearWindow(window_data_x11->display, window_data_x11->window);
    XMapRaised(window_data_x11->display, window_data_x11->window);
    XFlush(window_data_x11->display);

    window_data_x11->gc = DefaultGC(window_data_x11->display, window_data_x11->screen);

    window_data_x11->timer = mfb_timer_create();

    mfb_set_keyboard_callback((struct mfb_window *) window_data, keyboard_default);

#if defined(_DEBUG) || defined(DEBUG)
    printf("Window created using X11 API\n");
#endif

    window_data->is_initialized = true;
    return (struct mfb_window *) window_data;
}